

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O0

void composition_destination_over(uint32_t *dest,int length,uint32_t *src,uint32_t const_alpha)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t s;
  uint32_t d_1;
  int i_1;
  uint32_t d;
  int i;
  uint32_t const_alpha_local;
  uint32_t *src_local;
  int length_local;
  uint32_t *dest_local;
  
  if (const_alpha == 0xff) {
    for (i_1 = 0; i_1 < length; i_1 = i_1 + 1) {
      uVar1 = dest[i_1];
      uVar2 = BYTE_MUL(src[i_1],(uVar1 ^ 0xffffffff) >> 0x18);
      dest[i_1] = uVar1 + uVar2;
    }
  }
  else {
    for (s = 0; (int)s < length; s = s + 1) {
      uVar1 = dest[(int)s];
      uVar2 = BYTE_MUL(src[(int)s],const_alpha);
      uVar2 = BYTE_MUL(uVar2,(uVar1 ^ 0xffffffff) >> 0x18);
      dest[(int)s] = uVar1 + uVar2;
    }
  }
  return;
}

Assistant:

static void composition_destination_over(uint32_t* dest, int length, const uint32_t* src, uint32_t const_alpha)
{
    if(const_alpha == 255) {
        for(int i = 0; i < length; i++) {
            uint32_t d = dest[i];
            dest[i] = d + BYTE_MUL(src[i], plutovg_alpha(~d));
        }
    } else {
        for(int i = 0; i < length; i++) {
            uint32_t d = dest[i];
            uint32_t s = BYTE_MUL(src[i], const_alpha);
            dest[i] = d + BYTE_MUL(s, plutovg_alpha(~d));
        }
    }
}